

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_stage8_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i alVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  
  alVar4 = *x;
  alVar5 = x[1];
  alVar1 = x[2];
  alVar2 = x[3];
  alVar39 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0xf]);
  *x = alVar39;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0xf]);
  x[0xf] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar5,(undefined1  [16])x[0xe]);
  x[1] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar5,(undefined1  [16])x[0xe]);
  x[0xe] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0xd]);
  x[2] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0xd]);
  x[0xd] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[0xc]);
  x[3] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[0xc]);
  x[0xc] = alVar4;
  alVar4 = x[4];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0xb]);
  x[4] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0xb]);
  x[0xb] = alVar4;
  alVar4 = x[5];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[10]);
  x[5] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[10]);
  x[10] = alVar4;
  alVar4 = x[6];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[9]);
  x[6] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[9]);
  x[9] = alVar4;
  alVar4 = x[7];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[8]);
  x[7] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[8]);
  x[8] = alVar4;
  alVar4 = x[0x14];
  auVar6._0_12_ = alVar4._0_12_;
  auVar6._12_2_ = alVar4[0]._6_2_;
  auVar6._14_2_ = *(undefined2 *)((long)x[0x1b] + 6);
  auVar40._12_4_ = auVar6._12_4_;
  auVar40._0_10_ = alVar4._0_10_;
  auVar40._10_2_ = *(undefined2 *)((long)x[0x1b] + 4);
  auVar34._10_6_ = auVar40._10_6_;
  auVar34._0_8_ = alVar4[0];
  auVar34._8_2_ = alVar4[0]._4_2_;
  auVar25._8_8_ = auVar34._8_8_;
  auVar25._6_2_ = *(undefined2 *)((long)x[0x1b] + 2);
  auVar25._4_2_ = alVar4[0]._2_2_;
  auVar25._0_2_ = (undefined2)alVar4[0];
  auVar25._2_2_ = (short)x[0x1b][0];
  auVar24._2_2_ = (short)x[0x1b][1];
  auVar24._0_2_ = (short)alVar4[1];
  auVar24._4_2_ = alVar4[1]._2_2_;
  auVar24._6_2_ = *(undefined2 *)((long)x[0x1b] + 10);
  auVar24._8_2_ = alVar4[1]._4_2_;
  auVar24._10_2_ = *(undefined2 *)((long)x[0x1b] + 0xc);
  auVar24._12_2_ = alVar4[1]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)x[0x1b] + 0xe);
  auVar3._8_4_ = 0xb50f4b0;
  auVar3._0_8_ = 0xb50f4b00b50f4b0;
  auVar3._12_4_ = 0xb50f4b0;
  auVar34 = pmaddwd(auVar25,auVar3);
  auVar40 = pmaddwd(auVar24,auVar3);
  auVar32._8_4_ = 0xb500b50;
  auVar32._0_8_ = 0xb500b500b500b50;
  auVar32._12_4_ = 0xb500b50;
  auVar7 = pmaddwd(auVar25,auVar32);
  auVar25 = pmaddwd(auVar24,auVar32);
  auVar35._0_4_ = auVar34._0_4_ + in_XMM0_Da >> 0xc;
  auVar35._4_4_ = auVar34._4_4_ + in_XMM0_Db >> 0xc;
  auVar35._8_4_ = auVar34._8_4_ + in_XMM0_Dc >> 0xc;
  auVar35._12_4_ = auVar34._12_4_ + in_XMM0_Dd >> 0xc;
  auVar41._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar41._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar41._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar41._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar35,auVar41);
  auVar8._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar8._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar8._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar8._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar26._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar26._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar26._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar26._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar8,auVar26);
  x[0x14] = alVar5;
  x[0x1b] = alVar4;
  alVar4 = x[0x15];
  auVar12._0_12_ = alVar4._0_12_;
  auVar12._12_2_ = alVar4[0]._6_2_;
  auVar12._14_2_ = *(undefined2 *)((long)x[0x1a] + 6);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = alVar4._0_10_;
  auVar11._10_2_ = *(undefined2 *)((long)x[0x1a] + 4);
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = alVar4[0];
  auVar10._8_2_ = alVar4[0]._4_2_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)x[0x1a] + 2);
  auVar9._4_2_ = alVar4[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar4[0];
  auVar9._2_2_ = (short)x[0x1a][0];
  auVar27._2_2_ = (short)x[0x1a][1];
  auVar27._0_2_ = (short)alVar4[1];
  auVar27._4_2_ = alVar4[1]._2_2_;
  auVar27._6_2_ = *(undefined2 *)((long)x[0x1a] + 10);
  auVar27._8_2_ = alVar4[1]._4_2_;
  auVar27._10_2_ = *(undefined2 *)((long)x[0x1a] + 0xc);
  auVar27._12_2_ = alVar4[1]._6_2_;
  auVar27._14_2_ = *(undefined2 *)((long)x[0x1a] + 0xe);
  auVar34 = pmaddwd(auVar9,auVar3);
  auVar40 = pmaddwd(auVar27,auVar3);
  auVar7 = pmaddwd(auVar9,auVar32);
  auVar25 = pmaddwd(auVar27,auVar32);
  auVar36._0_4_ = auVar34._0_4_ + in_XMM0_Da >> 0xc;
  auVar36._4_4_ = auVar34._4_4_ + in_XMM0_Db >> 0xc;
  auVar36._8_4_ = auVar34._8_4_ + in_XMM0_Dc >> 0xc;
  auVar36._12_4_ = auVar34._12_4_ + in_XMM0_Dd >> 0xc;
  auVar42._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar36,auVar42);
  auVar13._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar13._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar13._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar13._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar28._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar28._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar28._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar28._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar13,auVar28);
  x[0x15] = alVar5;
  x[0x1a] = alVar4;
  alVar4 = x[0x16];
  auVar17._0_12_ = alVar4._0_12_;
  auVar17._12_2_ = alVar4[0]._6_2_;
  auVar17._14_2_ = *(undefined2 *)((long)x[0x19] + 6);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = alVar4._0_10_;
  auVar16._10_2_ = *(undefined2 *)((long)x[0x19] + 4);
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = alVar4[0];
  auVar15._8_2_ = alVar4[0]._4_2_;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)x[0x19] + 2);
  auVar14._4_2_ = alVar4[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar4[0];
  auVar14._2_2_ = (short)x[0x19][0];
  auVar29._2_2_ = (short)x[0x19][1];
  auVar29._0_2_ = (short)alVar4[1];
  auVar29._4_2_ = alVar4[1]._2_2_;
  auVar29._6_2_ = *(undefined2 *)((long)x[0x19] + 10);
  auVar29._8_2_ = alVar4[1]._4_2_;
  auVar29._10_2_ = *(undefined2 *)((long)x[0x19] + 0xc);
  auVar29._12_2_ = alVar4[1]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)x[0x19] + 0xe);
  auVar34 = pmaddwd(auVar14,auVar3);
  auVar40 = pmaddwd(auVar29,auVar3);
  auVar7 = pmaddwd(auVar14,auVar32);
  auVar25 = pmaddwd(auVar29,auVar32);
  auVar37._0_4_ = auVar34._0_4_ + in_XMM0_Da >> 0xc;
  auVar37._4_4_ = auVar34._4_4_ + in_XMM0_Db >> 0xc;
  auVar37._8_4_ = auVar34._8_4_ + in_XMM0_Dc >> 0xc;
  auVar37._12_4_ = auVar34._12_4_ + in_XMM0_Dd >> 0xc;
  auVar43._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar37,auVar43);
  auVar18._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar30._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar30._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar30._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar30._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar18,auVar30);
  x[0x16] = alVar5;
  x[0x19] = alVar4;
  alVar4 = x[0x17];
  auVar22._0_12_ = alVar4._0_12_;
  auVar22._12_2_ = alVar4[0]._6_2_;
  auVar22._14_2_ = *(undefined2 *)((long)x[0x18] + 6);
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = alVar4._0_10_;
  auVar21._10_2_ = *(undefined2 *)((long)x[0x18] + 4);
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._0_8_ = alVar4[0];
  auVar20._8_2_ = alVar4[0]._4_2_;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x18] + 2);
  auVar19._4_2_ = alVar4[0]._2_2_;
  auVar19._0_2_ = (undefined2)alVar4[0];
  auVar19._2_2_ = (short)x[0x18][0];
  auVar31._2_2_ = (short)x[0x18][1];
  auVar31._0_2_ = (short)alVar4[1];
  auVar31._4_2_ = alVar4[1]._2_2_;
  auVar31._6_2_ = *(undefined2 *)((long)x[0x18] + 10);
  auVar31._8_2_ = alVar4[1]._4_2_;
  auVar31._10_2_ = *(undefined2 *)((long)x[0x18] + 0xc);
  auVar31._12_2_ = alVar4[1]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x18] + 0xe);
  auVar7 = pmaddwd(auVar19,auVar3);
  auVar3 = pmaddwd(auVar3,auVar31);
  auVar25 = pmaddwd(auVar19,auVar32);
  auVar32 = pmaddwd(auVar31,auVar32);
  auVar38._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar7._0_4_ = auVar3._0_4_ + in_XMM0_Da >> 0xc;
  auVar7._4_4_ = auVar3._4_4_ + in_XMM0_Db >> 0xc;
  auVar7._8_4_ = auVar3._8_4_ + in_XMM0_Dc >> 0xc;
  auVar7._12_4_ = auVar3._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar38,auVar7);
  auVar23._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  auVar33._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar23,auVar33);
  x[0x17] = alVar5;
  x[0x18] = alVar4;
  return;
}

Assistant:

static inline void idct32_stage8_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[15]);
  btf_16_adds_subs_sse2(x[1], x[14]);
  btf_16_adds_subs_sse2(x[2], x[13]);
  btf_16_adds_subs_sse2(x[3], x[12]);
  btf_16_adds_subs_sse2(x[4], x[11]);
  btf_16_adds_subs_sse2(x[5], x[10]);
  btf_16_adds_subs_sse2(x[6], x[9]);
  btf_16_adds_subs_sse2(x[7], x[8]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[23], x[24], x[23], x[24]);
}